

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileformat.cpp
# Opt level: O0

bool trackerboy::upgradeHeader(Header *header)

{
  uint8_t uVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint8_t uVar4;
  uint8_t local_1e;
  uchar maxbyte;
  uint16_t waveforms;
  uint16_t instruments;
  uint16_t framerate;
  uint8_t system;
  Header *header_local;
  
  if ((header->rev0).revision == '\0') {
    uVar1 = (header->rev0).system;
    uVar2 = (header->rev0).customFramerate;
    uVar3 = (header->rev0).numberOfWaveforms;
    if ((0xff < (header->rev0).numberOfInstruments) || (0xff < uVar3)) {
      return false;
    }
    (header->rev0).revision = '\x01';
    (header->rev0).system = '\0';
    (header->rev0).customFramerate = 0;
    local_1e = (uint8_t)(header->rev0).numberOfInstruments;
    (header->rev1).icount = local_1e;
    uVar4 = bias<int>(1);
    (header->rev1).scount = uVar4;
    (header->rev1).wcount = (uint8_t)uVar3;
    (header->rev1).system = uVar1;
    (header->rev1).customFramerate = uVar2;
  }
  return true;
}

Assistant:

bool upgradeHeader(Header &header) noexcept {

    // upgrade incrementally to the current major
    switch (header.current.revMajor) {
        case 0: {
            // 0 -> 1 changes in header:
            // system, customFramerate moved to offset 127 (after wcount)
            // revision -> revMajor
            // system -> revMinor
            // customFramerate -> reserved
            auto const system = header.rev0.system;
            auto const framerate = header.rev0.customFramerate;
            auto const instruments = header.rev0.numberOfInstruments;
            auto const waveforms = header.rev0.numberOfWaveforms;

            constexpr auto maxbyte = std::numeric_limits<uint8_t>::max();
            if (instruments > maxbyte || waveforms > maxbyte) {
                return false;
            }

            header.rev1.revMajor = 1;
            header.rev1.revMinor = 0;
            header.rev1.reserved = 0;
            header.rev1.icount = (uint8_t)instruments;
            header.rev1.scount = bias(1);
            header.rev1.wcount = (uint8_t)waveforms;
            header.rev1.system = system;
            header.rev1.customFramerate = framerate;
        }
            [[fallthrough]];
        default:
            return true;
    }
}